

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *__rhs;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&local_60);
  __rhs = getenv("XML_OUTPUT_FILE");
  if (__rhs != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"xml:",&local_19);
    std::operator+(&local_60,&local_40,__rhs);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (nullptr != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}